

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

triplet<unsigned_short> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::encoder_strategy>
::encode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::encoder_strategy>
           *this,triplet<unsigned_short> x,triplet<unsigned_short> ra,triplet<unsigned_short> rb)

{
  anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5 aVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  uint uVar5;
  int iVar6;
  int32_t error_value;
  int32_t error_value_00;
  int32_t error_value_01;
  triplet<unsigned_short> tVar7;
  default_traits<unsigned_short,_charls::triplet<unsigned_short>_> *this_00;
  reference pvVar8;
  undefined2 in_register_0000000e;
  uchar *puVar9;
  undefined2 in_register_00000016;
  size_t *siglen;
  size_t *siglen_00;
  size_t *siglen_01;
  size_t *siglen_02;
  size_t *siglen_03;
  undefined2 in_register_00000036;
  uchar *puVar10;
  array<charls::context_run_mode,_2UL> *this_01;
  size_t in_R8;
  int32_t error_value3;
  int32_t error_value2;
  int32_t error_value1;
  jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::encoder_strategy>
  *this_local;
  triplet<unsigned_short> rb_local;
  triplet<unsigned_short> ra_local;
  triplet<unsigned_short> x_local;
  
  ra_local.field_1.v2 = (unsigned_short)x.field_2;
  aVar1 = rb.field_2;
  uVar5 = rb._0_4_;
  this_00 = &this->traits_;
  iVar6 = charls::sign((EVP_PKEY_CTX *)(ulong)((uVar5 & 0xffff) - (ra._0_4_ & 0xffff)),
                       (uchar *)(CONCAT26(in_register_00000036,x) >> 0x20),
                       (size_t *)CONCAT26(in_register_00000016,ra),
                       (uchar *)CONCAT26(in_register_0000000e,rb),in_R8);
  this_local._0_2_ = rb.field_0;
  puVar9 = (uchar *)(ulong)this_local._0_2_;
  error_value = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::
                compute_error_value(this_00,iVar6 * ((x._0_4_ & 0xffff) - (uVar5 & 0xffff)));
  this_01 = &this->context_run_mode_;
  pvVar8 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  encode_run_interruption_error(this,pvVar8,error_value);
  this_local._2_2_ = rb.field_1;
  rb_local.field_0.v1 = (unsigned_short)ra.field_1;
  iVar6 = charls::sign((EVP_PKEY_CTX *)(ulong)((uint)this_local._2_2_ - (uint)rb_local.field_0.v1),
                       (uchar *)pvVar8,siglen,puVar9,in_R8);
  ra_local.field_0.v1 = (unsigned_short)x.field_1;
  puVar9 = (uchar *)(ulong)this_local._2_2_;
  error_value_00 =
       default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::compute_error_value
                 (this_00,iVar6 * ((uint)ra_local.field_0.v1 - (uint)this_local._2_2_));
  pvVar8 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  encode_run_interruption_error(this,pvVar8,error_value_00);
  iVar6 = charls::sign((EVP_PKEY_CTX *)(ulong)((uint)aVar1.v3 - (uint)ra.field_2.v3),(uchar *)pvVar8
                       ,siglen_00,puVar9,in_R8);
  puVar9 = (uchar *)(ulong)aVar1.v3;
  error_value_01 =
       default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::compute_error_value
                 (this_00,iVar6 * ((uint)ra_local.field_1.v2 - (uint)aVar1.v3));
  pvVar8 = std::array<charls::context_run_mode,_2UL>::operator[](this_01,0);
  encode_run_interruption_error(this,pvVar8,error_value_01);
  uVar5 = uVar5 & 0xffff;
  iVar6 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar5 - (ra._0_4_ & 0xffff)),(uchar *)pvVar8,
                       siglen_01,puVar9,in_R8);
  puVar10 = (uchar *)(ulong)uVar5;
  uVar2 = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::
          compute_reconstructed_sample(this_00,uVar5,error_value * iVar6);
  uVar5 = (uint)this_local._2_2_;
  iVar6 = charls::sign((EVP_PKEY_CTX *)(ulong)(uVar5 - rb_local.field_0.v1),puVar10,siglen_02,puVar9
                       ,in_R8);
  puVar10 = (uchar *)(ulong)uVar5;
  uVar3 = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::
          compute_reconstructed_sample(this_00,uVar5,error_value_00 * iVar6);
  iVar6 = charls::sign((EVP_PKEY_CTX *)(ulong)((uint)aVar1.v3 - (uint)ra.field_2.v3),puVar10,
                       siglen_03,puVar9,in_R8);
  uVar4 = default_traits<unsigned_short,_charls::triplet<unsigned_short>_>::
          compute_reconstructed_sample(this_00,(uint)aVar1.v3,error_value_01 * iVar6);
  triplet<unsigned_short>::triplet
            ((triplet<unsigned_short> *)&ra_local.field_2,(uint)uVar2,(uint)uVar3,(uint)uVar4);
  tVar7.field_2.v3 = x_local.field_1.v2;
  tVar7.field_0.v1 = ra_local.field_2.v3;
  tVar7.field_1.v2 = x_local.field_0.v1;
  return tVar7;
}

Assistant:

triplet<sample_type> encode_run_interruption_pixel(const triplet<sample_type> x, const triplet<sample_type> ra,
                                                       const triplet<sample_type> rb)
    {
        const int32_t error_value1{traits_.compute_error_value(sign(rb.v1 - ra.v1) * (x.v1 - rb.v1))};
        encode_run_interruption_error(context_run_mode_[0], error_value1);

        const int32_t error_value2{traits_.compute_error_value(sign(rb.v2 - ra.v2) * (x.v2 - rb.v2))};
        encode_run_interruption_error(context_run_mode_[0], error_value2);

        const int32_t error_value3{traits_.compute_error_value(sign(rb.v3 - ra.v3) * (x.v3 - rb.v3))};
        encode_run_interruption_error(context_run_mode_[0], error_value3);

        return triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                    traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                    traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3)));
    }